

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gpnp5::sPolynomial30
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0xab0];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xfa] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xadc] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x126] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb08] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0x901];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x152] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb34] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x92d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x17e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb60] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x1aa] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb8c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x1d6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[3000] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x202] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0x959] / dVar2;
  dVar3 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0x9b1];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x22e] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0x985] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x286] = -dVar3 / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x30a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbe4] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x9dd] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x336] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc10] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x362] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc3c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x38e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc68] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x3ba] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xa09] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x43e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc94] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x5f6] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb3d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x622] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb69] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x67a] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb95] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x6fe] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xbc1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x7ae] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xbed] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x7da] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xc19] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x832] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xc45] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x8b6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcc0] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc71] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x8e2] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcec] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x90e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd18] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x93a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd44] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x966] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xc9d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x9ea] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd70] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xa42] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xcc9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xa6e] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xcf5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xac6] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd21] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb4a] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd4d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xbfa] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd79] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xc7e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd9c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xcd6] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xda5] / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::sPolynomial30( Eigen::Matrix<double,44,80> & groebnerMatrix )
{
  groebnerMatrix(30,5) = groebnerMatrix(8,63)/(groebnerMatrix(8,62));
  groebnerMatrix(30,6) = groebnerMatrix(8,64)/(groebnerMatrix(8,62));
  groebnerMatrix(30,7) = (groebnerMatrix(8,65)/(groebnerMatrix(8,62))-groebnerMatrix(17,53)/(groebnerMatrix(17,52)));
  groebnerMatrix(30,8) = groebnerMatrix(8,66)/(groebnerMatrix(8,62));
  groebnerMatrix(30,9) = groebnerMatrix(8,67)/(groebnerMatrix(8,62));
  groebnerMatrix(30,10) = groebnerMatrix(8,68)/(groebnerMatrix(8,62));
  groebnerMatrix(30,11) = -groebnerMatrix(17,54)/(groebnerMatrix(17,52));
  groebnerMatrix(30,12) = -groebnerMatrix(17,55)/(groebnerMatrix(17,52));
  groebnerMatrix(30,14) = -groebnerMatrix(17,56)/(groebnerMatrix(17,52));
  groebnerMatrix(30,17) = (groebnerMatrix(8,69)/(groebnerMatrix(8,62))-groebnerMatrix(17,57)/(groebnerMatrix(17,52)));
  groebnerMatrix(30,18) = groebnerMatrix(8,70)/(groebnerMatrix(8,62));
  groebnerMatrix(30,19) = groebnerMatrix(8,71)/(groebnerMatrix(8,62));
  groebnerMatrix(30,20) = groebnerMatrix(8,72)/(groebnerMatrix(8,62));
  groebnerMatrix(30,21) = -groebnerMatrix(17,58)/(groebnerMatrix(17,52));
  groebnerMatrix(30,24) = groebnerMatrix(8,73)/(groebnerMatrix(8,62));
  groebnerMatrix(30,34) = -groebnerMatrix(17,65)/(groebnerMatrix(17,52));
  groebnerMatrix(30,35) = -groebnerMatrix(17,66)/(groebnerMatrix(17,52));
  groebnerMatrix(30,37) = -groebnerMatrix(17,67)/(groebnerMatrix(17,52));
  groebnerMatrix(30,40) = -groebnerMatrix(17,68)/(groebnerMatrix(17,52));
  groebnerMatrix(30,44) = -groebnerMatrix(17,69)/(groebnerMatrix(17,52));
  groebnerMatrix(30,45) = -groebnerMatrix(17,70)/(groebnerMatrix(17,52));
  groebnerMatrix(30,47) = -groebnerMatrix(17,71)/(groebnerMatrix(17,52));
  groebnerMatrix(30,50) = (groebnerMatrix(8,74)/(groebnerMatrix(8,62))-groebnerMatrix(17,72)/(groebnerMatrix(17,52)));
  groebnerMatrix(30,51) = groebnerMatrix(8,75)/(groebnerMatrix(8,62));
  groebnerMatrix(30,52) = groebnerMatrix(8,76)/(groebnerMatrix(8,62));
  groebnerMatrix(30,53) = groebnerMatrix(8,77)/(groebnerMatrix(8,62));
  groebnerMatrix(30,54) = -groebnerMatrix(17,73)/(groebnerMatrix(17,52));
  groebnerMatrix(30,57) = groebnerMatrix(8,78)/(groebnerMatrix(8,62));
  groebnerMatrix(30,59) = -groebnerMatrix(17,74)/(groebnerMatrix(17,52));
  groebnerMatrix(30,60) = -groebnerMatrix(17,75)/(groebnerMatrix(17,52));
  groebnerMatrix(30,62) = -groebnerMatrix(17,76)/(groebnerMatrix(17,52));
  groebnerMatrix(30,65) = -groebnerMatrix(17,77)/(groebnerMatrix(17,52));
  groebnerMatrix(30,69) = -groebnerMatrix(17,78)/(groebnerMatrix(17,52));
  groebnerMatrix(30,72) = groebnerMatrix(8,79)/(groebnerMatrix(8,62));
  groebnerMatrix(30,74) = -groebnerMatrix(17,79)/(groebnerMatrix(17,52));
}